

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

bitset<128UL>
jsoncons::decode_traits<std::bitset<128ul>,char,void>::
decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
          (basic_staj_cursor<char> *cursor,
          json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          *decoder,error_code *ec)

{
  error_code ec_00;
  error_code ec_01;
  bool bVar1;
  undefined8 uVar2;
  error_category *peVar3;
  ser_error *this;
  long *plVar4;
  size_t line;
  long *column;
  error_code *in_RDX;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_RSI;
  long *in_RDI;
  _Base_bitset<2UL> _Var5;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  conv_errc __e;
  error_code *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  ser_error *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  error_category *in_stack_ffffffffffffff70;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_ffffffffffffff88;
  
  __e = (conv_errc)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::reset(in_stack_ffffffffffffff30);
  (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI,in_RDX);
  bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
  if (bVar1) {
    uVar2 = __cxa_allocate_exception(0x58);
    plVar4 = (long *)(**(code **)(*in_RDI + 0x48))();
    (**(code **)(*plVar4 + 0x10))();
    plVar4 = (long *)(**(code **)(*in_RDI + 0x48))();
    peVar3 = (error_category *)(**(code **)(*plVar4 + 0x18))();
    ec_00._M_cat = peVar3;
    ec_00._0_8_ = in_stack_ffffffffffffff68;
    ser_error::ser_error
              (in_stack_ffffffffffffff60,ec_00,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
  }
  bVar1 = json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          ::is_valid(in_RSI);
  if (!bVar1) {
    this = (ser_error *)__cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::conv_errc,void>(in_stack_ffffffffffffff40,__e);
    plVar4 = (long *)(**(code **)(*in_RDI + 0x48))();
    line = (**(code **)(*plVar4 + 0x10))();
    column = (long *)(**(code **)(*in_RDI + 0x48))();
    (**(code **)(*column + 0x18))();
    ec_01._M_cat = in_stack_ffffffffffffff70;
    ec_01._0_8_ = plVar4;
    ser_error::ser_error(this,ec_01,line,(size_t)column);
    __cxa_throw(this,&ser_error::typeinfo,ser_error::~ser_error);
  }
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::get_result(in_stack_ffffffffffffff88);
  _Var5._M_w = (_WordT  [2])
               basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as<std::bitset<128ul>>
                         ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                          0x2b7ed3);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x2b7f03);
  return (_Base_bitset<2UL>)(_Base_bitset<2UL>)_Var5._M_w;
}

Assistant:

static T decode(basic_staj_cursor<CharT>& cursor, 
            json_decoder<Json,TempAllocator>& decoder, 
            std::error_code& ec)
        {
            decoder.reset();
            cursor.read_to(decoder, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec, cursor.context().line(), cursor.context().column()));
            }
            else if (!decoder.is_valid())
            {
                JSONCONS_THROW(ser_error(conv_errc::conversion_failed, cursor.context().line(), cursor.context().column()));
            }
            return decoder.get_result().template as<T>();
        }